

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

cio_error bs_read_at_most_from_buffer
                    (cio_buffered_stream *buffered_stream,cio_read_buffer *buffer,size_t num,
                    cio_buffered_stream_read_handler_t handler,void *handler_context)

{
  void *handler_context_local;
  cio_buffered_stream_read_handler_t handler_local;
  size_t num_local;
  cio_read_buffer *buffer_local;
  cio_buffered_stream *buffered_stream_local;
  
  if (frame_buffer_fill_pos < frame_buffer_read_pos) {
    (*handler)(buffered_stream,handler_context,CIO_EOF,buffer,num);
  }
  else {
    memcpy(buffer->add_ptr,frame_buffer + frame_buffer_read_pos,num);
    buffer->add_ptr = buffer->add_ptr + num;
    frame_buffer_read_pos = num + frame_buffer_read_pos;
    (*handler)(buffered_stream,handler_context,CIO_SUCCESS,buffer,num);
  }
  return CIO_SUCCESS;
}

Assistant:

static enum cio_error bs_read_at_most_from_buffer(struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer, size_t num, cio_buffered_stream_read_handler_t handler, void *handler_context)
{
	if (frame_buffer_read_pos > frame_buffer_fill_pos) {
		handler(buffered_stream, handler_context, CIO_EOF, buffer, num);
	} else {
		memcpy(buffer->add_ptr, &frame_buffer[frame_buffer_read_pos], num);
		buffer->add_ptr += num;
		frame_buffer_read_pos += num;

		handler(buffered_stream, handler_context, CIO_SUCCESS, buffer, num);
	}
	return CIO_SUCCESS;
}